

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim.cpp
# Opt level: O0

Animation * rw::Animation::streamRead(Stream *stream)

{
  int32 iVar1;
  int32 flags_00;
  AnimInterpolatorInfo *interpInfo_00;
  float32 duration_00;
  float duration;
  int32 flags;
  int32 numFrames;
  AnimInterpolatorInfo *interpInfo;
  int32 typeID;
  Animation *anim;
  Stream *stream_local;
  
  iVar1 = Stream::readI32(stream);
  if (iVar1 == 0x100) {
    iVar1 = Stream::readI32(stream);
    interpInfo_00 = AnimInterpolatorInfo::find(iVar1);
    iVar1 = Stream::readI32(stream);
    flags_00 = Stream::readI32(stream);
    duration_00 = Stream::readF32(stream);
    stream_local = (Stream *)create(interpInfo_00,iVar1,flags_00,(float)duration_00);
    (*interpInfo_00->streamRead)(stream,(Animation *)stream_local);
  }
  else {
    stream_local = (Stream *)0x0;
  }
  return (Animation *)stream_local;
}

Assistant:

Animation*
Animation::streamRead(Stream *stream)
{
	Animation *anim;
	if(stream->readI32() != 0x100)
		return nil;
	int32 typeID = stream->readI32();
	AnimInterpolatorInfo *interpInfo = AnimInterpolatorInfo::find(typeID);
	int32 numFrames = stream->readI32();
	int32 flags = stream->readI32();
	float duration = stream->readF32();
	anim = Animation::create(interpInfo, numFrames, flags, duration);
	interpInfo->streamRead(stream, anim);
	return anim;
}